

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Tracks::Parse(Tracks *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  Track **ppTVar3;
  long lVar4;
  long lVar5;
  long status_2;
  Track **pTrack;
  longlong element_size;
  longlong payload_stop;
  long status_1;
  longlong payload_size;
  longlong id_1;
  longlong element_start;
  long status;
  longlong size;
  longlong id;
  longlong pos;
  longlong count;
  IMkvReader *pReader;
  longlong stop;
  Tracks *this_local;
  
  stop = (longlong)this;
  if (this->m_trackEntries != (Track **)0x0) {
    __assert_fail("m_trackEntries == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x162b,"long mkvparser::Tracks::Parse()");
  }
  if (this->m_trackEntriesEnd != (Track **)0x0) {
    __assert_fail("m_trackEntriesEnd == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x162c,"long mkvparser::Tracks::Parse()");
  }
  pReader = (IMkvReader *)(this->m_start + this->m_size);
  count = (longlong)this->m_pSegment->m_pReader;
  pos = 0;
  id = this->m_start;
  while (id < (long)pReader) {
    element_start = ParseElementHeader((IMkvReader *)count,&id,(longlong)pReader,&size,&status);
    if (element_start < 0) {
      return element_start;
    }
    if (status != 0) {
      if ((size == 0xae) && (pos = pos + 1, 0x7fffffff < pos)) {
        return -1;
      }
      id = status + id;
      if ((long)pReader < id) {
        return -2;
      }
    }
  }
  if ((IMkvReader *)id != pReader) {
    return -2;
  }
  if (0 < pos) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pos;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    ppTVar3 = (Track **)operator_new__(uVar2,(nothrow_t *)&std::nothrow);
    this->m_trackEntries = ppTVar3;
    if (this->m_trackEntries == (Track **)0x0) {
      return -1;
    }
    this->m_trackEntriesEnd = this->m_trackEntries;
    id = this->m_start;
    do {
      do {
        if ((long)pReader <= id) {
          if ((IMkvReader *)id != pReader) {
            return -2;
          }
          return 0;
        }
        id_1 = id;
        lVar4 = ParseElementHeader((IMkvReader *)count,&id,(longlong)pReader,&payload_size,&status_1
                                  );
        if (lVar4 < 0) {
          return lVar4;
        }
      } while (status_1 == 0);
      lVar4 = id + status_1;
      if ((long)pReader < lVar4) {
        __assert_fail("payload_stop <= stop",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1668,"long mkvparser::Tracks::Parse()");
      }
      if (payload_size == 0xae) {
        ppTVar3 = this->m_trackEntriesEnd;
        *ppTVar3 = (Track *)0x0;
        lVar5 = ParseTrackEntry(this,id,status_1,id_1,lVar4 - id_1,ppTVar3);
        if (lVar5 != 0) {
          return lVar5;
        }
        if (*ppTVar3 != (Track *)0x0) {
          this->m_trackEntriesEnd = this->m_trackEntriesEnd + 1;
        }
      }
      id = lVar4;
    } while (lVar4 <= (long)pReader);
    return -2;
  }
  return 0;
}

Assistant:

long Tracks::Parse() {
  assert(m_trackEntries == NULL);
  assert(m_trackEntriesEnd == NULL);

  const long long stop = m_start + m_size;
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long count = 0;
  long long pos = m_start;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvTrackEntry) {
      ++count;
      if (count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  if (count <= 0)
    return 0;  // success

  m_trackEntries = new (std::nothrow) Track*[static_cast<size_t>(count)];

  if (m_trackEntries == NULL)
    return -1;

  m_trackEntriesEnd = m_trackEntries;

  pos = m_start;

  while (pos < stop) {
    const long long element_start = pos;

    long long id, payload_size;

    const long status =
        ParseElementHeader(pReader, pos, stop, id, payload_size);

    if (status < 0)  // error
      return status;

    if (payload_size == 0)  // weird
      continue;

    const long long payload_stop = pos + payload_size;
    assert(payload_stop <= stop);  // checked in ParseElement

    const long long element_size = payload_stop - element_start;

    if (id == libwebm::kMkvTrackEntry) {
      Track*& pTrack = *m_trackEntriesEnd;
      pTrack = NULL;

      const long status = ParseTrackEntry(pos, payload_size, element_start,
                                          element_size, pTrack);
      if (status)
        return status;

      if (pTrack)
        ++m_trackEntriesEnd;
    }

    pos = payload_stop;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}